

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_ec251c::cmEnumPathSegmentsGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmEnumPathSegmentsGenerator *this,string *parent)

{
  basic_string_view<char,_std::char_traits<char>_> *args;
  char local_9;
  
  args = (this->Current)._M_current;
  if (args == (((this->Names)._M_data)->
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_9 = '/';
    (this->Current)._M_current = args + 1;
    cmStrCat<std::__cxx11::string_const&,char,std::basic_string_view<char,std::char_traits<char>>const&>
              (__return_storage_ptr__,parent,&local_9,args);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (this->Current != this->Names.get().cend()) {
      return cmStrCat(parent, '/', *this->Current++);
    }
    return {};
  }